

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::session_impl::add_dht_router
          (session_impl *this,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
          *node)

{
  session_impl *local_78;
  code *local_70;
  undefined8 local_68;
  type local_60;
  callback_t local_40;
  resolver_flags local_19;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *local_18;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *node_local;
  session_impl *this_local;
  
  this->m_outstanding_router_lookups = this->m_outstanding_router_lookups + 1;
  local_19.m_val = '\x02';
  local_70 = on_dht_router_name_lookup;
  local_68 = 0;
  local_78 = this;
  local_18 = node;
  node_local = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                *)this;
  ::std::
  bind<void(libtorrent::aux::session_impl::*)(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&,int),libtorrent::aux::session_impl*,std::_Placeholder<1>const&,std::_Placeholder<2>const&,int_const&>
            (&local_60,(offset_in_session_impl_to_subr *)&local_70,&local_78,
             (_Placeholder<1> *)&::std::placeholders::_1,(_Placeholder<2> *)&::std::placeholders::_2
             ,&node->second);
  ::std::
  function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>
  ::
  function<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>,std::_Placeholder<2>,int))(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&,int)>,void>
            ((function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>
              *)&local_40,&local_60);
  resolver::async_resolve(&this->m_host_resolver,&node->first,local_19,&local_40);
  ::std::
  function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
  ::~function(&local_40);
  return;
}

Assistant:

void session_impl::add_dht_router(std::pair<std::string, int> const& node)
	{
		ADD_OUTSTANDING_ASYNC("session_impl::on_dht_router_name_lookup");
		++m_outstanding_router_lookups;
		m_host_resolver.async_resolve(node.first, resolver::abort_on_shutdown
			, std::bind(&session_impl::on_dht_router_name_lookup
				, this, _1, _2, node.second));
	}